

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

int __thiscall
tcu::ConstPixelBufferAccess::getPixStencil(ConstPixelBufferAccess *this,int x,int y,int z)

{
  ChannelType CVar1;
  byte bVar2;
  deUint8 *src;
  deUint8 *pixelPtr;
  int z_local;
  int y_local;
  int x_local;
  ConstPixelBufferAccess *this_local;
  
  src = (deUint8 *)getPixelPtr(this,x,y,z);
  CVar1 = (this->m_format).type;
  if (CVar1 - UNSIGNED_INT_16_8_8 < 2) {
    bVar2 = anon_unknown_75::readUint32Low8(src);
    this_local._4_4_ = (uint)bVar2;
  }
  else if (CVar1 == UNSIGNED_INT_24_8_REV) {
    bVar2 = anon_unknown_75::readUint32High8(src);
    this_local._4_4_ = (uint)bVar2;
  }
  else if (CVar1 == FLOAT_UNSIGNED_INT_24_8_REV) {
    bVar2 = anon_unknown_75::readUint32Low8(src + 4);
    this_local._4_4_ = (uint)bVar2;
  }
  else {
    this_local._4_4_ = anon_unknown_75::channelToInt(src,(this->m_format).type);
  }
  return this_local._4_4_;
}

Assistant:

int ConstPixelBufferAccess::getPixStencil (int x, int y, int z) const
{
	DE_ASSERT(de::inBounds(x, 0, getWidth()));
	DE_ASSERT(de::inBounds(y, 0, getHeight()));
	DE_ASSERT(de::inBounds(z, 0, getDepth()));

	const deUint8* const pixelPtr = (const deUint8*)getPixelPtr(x, y, z);

	switch (m_format.type)
	{
		case TextureFormat::UNSIGNED_INT_24_8_REV:
			DE_ASSERT(m_format.order == TextureFormat::DS);
			return (int)readUint32High8(pixelPtr);

		case TextureFormat::UNSIGNED_INT_16_8_8:
		case TextureFormat::UNSIGNED_INT_24_8:
			DE_ASSERT(m_format.order == TextureFormat::DS);
			return (int)readUint32Low8(pixelPtr);

		case TextureFormat::FLOAT_UNSIGNED_INT_24_8_REV:
			DE_ASSERT(m_format.order == TextureFormat::DS);
			return (int)readUint32Low8(pixelPtr + 4);

		default:
		{
			DE_ASSERT(m_format.order == TextureFormat::S); // no other combined depth stencil types
			return channelToInt(pixelPtr, m_format.type);
		}
	}
}